

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O3

void SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CMutableTransaction>
               (CMutableTransaction *tx,ParamsStream<SizeComputer_&,_TransactionSerParams> *s,
               TransactionSerParams *params)

{
  _Vector_impl_data *p_Var1;
  bool bVar2;
  pointer pvVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  pointer *ppvVar7;
  pointer pCVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  vector<CTxIn,_std::allocator<CTxIn>_> vinDummy;
  vector<CTxIn,_std::allocator<CTxIn>_> local_58;
  VectorFormatter<DefaultFormatter> local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = params->allow_witness;
  s->m_substream->nSize = s->m_substream->nSize + 4;
  if (bVar2 == true) {
    pCVar8 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pCVar8;
    if (lVar5 != 0) {
      uVar6 = (lVar5 >> 3) * 0x4ec4ec4ec4ec4ec5;
      if (*(pointer *)
           &(pCVar8->scriptWitness).stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          == *(pointer *)((long)&(pCVar8->scriptWitness).stack + 8)) {
        ppvVar7 = (pointer *)((long)&pCVar8[1].scriptWitness.stack + 8);
        uVar4 = 1;
        do {
          uVar9 = uVar4;
          if (uVar6 + (uVar6 == 0) == uVar9) break;
          p_Var1 = (_Vector_impl_data *)(ppvVar7 + -1);
          pvVar3 = *ppvVar7;
          ppvVar7 = ppvVar7 + 0xd;
          uVar4 = uVar9 + 1;
        } while (p_Var1->_M_start == pvVar3);
        if (uVar6 <= uVar9) goto LAB_0044f37a;
      }
      local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      VectorFormatter<DefaultFormatter>::
      Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<CTxIn,std::allocator<CTxIn>>>
                (&local_39,s,&local_58);
      s->m_substream->nSize = s->m_substream->nSize + 1;
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_58);
      VectorFormatter<DefaultFormatter>::
      Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<CTxIn,std::allocator<CTxIn>>>
                ((VectorFormatter<DefaultFormatter> *)&local_58,s,&tx->vin);
      VectorFormatter<DefaultFormatter>::
      Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<CTxOut,std::allocator<CTxOut>>>
                ((VectorFormatter<DefaultFormatter> *)&local_58,s,&tx->vout);
      pCVar8 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_finish != pCVar8) {
        lVar5 = 0x50;
        uVar6 = 0;
        do {
          VectorFormatter<DefaultFormatter>::
          Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    ((VectorFormatter<DefaultFormatter> *)&local_58,s,
                     (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)((pCVar8->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                        lVar5));
          uVar6 = uVar6 + 1;
          pCVar8 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar5 = lVar5 + 0x68;
        } while (uVar6 < (ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pCVar8 >>
                                 3) * 0x4ec4ec4ec4ec4ec5));
      }
      goto LAB_0044f39a;
    }
  }
LAB_0044f37a:
  VectorFormatter<DefaultFormatter>::
  Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<CTxIn,std::allocator<CTxIn>>>
            ((VectorFormatter<DefaultFormatter> *)&local_58,s,&tx->vin);
  VectorFormatter<DefaultFormatter>::
  Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<CTxOut,std::allocator<CTxOut>>>
            ((VectorFormatter<DefaultFormatter> *)&local_58,s,&tx->vout);
LAB_0044f39a:
  s->m_substream->nSize = s->m_substream->nSize + 4;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SerializeTransaction(const TxType& tx, Stream& s, const TransactionSerParams& params)
{
    const bool fAllowWitness = params.allow_witness;

    s << tx.version;
    unsigned char flags = 0;
    // Consistency check
    if (fAllowWitness) {
        /* Check whether witnesses need to be serialized. */
        if (tx.HasWitness()) {
            flags |= 1;
        }
    }
    if (flags) {
        /* Use extended format in case witnesses are to be serialized. */
        std::vector<CTxIn> vinDummy;
        s << vinDummy;
        s << flags;
    }
    s << tx.vin;
    s << tx.vout;
    if (flags & 1) {
        for (size_t i = 0; i < tx.vin.size(); i++) {
            s << tx.vin[i].scriptWitness.stack;
        }
    }
    s << tx.nLockTime;
}